

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_opc_special_r6(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  ushort uVar1;
  _Bool _Var2;
  uint rs_00;
  uint rt_00;
  uint rd_00;
  uint uVar3;
  uint opc;
  uint32_t uVar4;
  uint32_t op2;
  uint32_t op1;
  int sa;
  int rd;
  int rt;
  int rs;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  rs_00 = ctx->opcode >> 0x15 & 0x1f;
  uVar1 = *(ushort *)((long)&ctx->opcode + 2);
  rt_00 = uVar1 & 0x1f;
  rd_00 = ctx->opcode >> 0xb & 0x1f;
  uVar3 = ctx->opcode >> 6 & 0x1f;
  opc = ctx->opcode & 0xfc00003f;
  switch(opc) {
  case 5:
    uVar4 = extract32(ctx->opcode,6,2);
    gen_lsa(ctx,opc,rd_00,rs_00,rt_00,uVar4);
    break;
  default:
    generate_exception_end(ctx,0x14);
    break;
  case 0xe:
    uVar4 = extract32(ctx->opcode,6,0x14);
    _Var2 = is_uhi(uVar4);
    if (!_Var2) {
      if ((ctx->hflags & 0x400000) == 0) {
        generate_exception_end(ctx,0x10);
      }
      else {
        generate_exception_end(ctx,0x14);
      }
    }
    break;
  case 0x10:
  case 0x11:
    if (((uVar1 & 0x1f) == 0) && (uVar3 == 1)) {
      gen_cl(ctx,opc,rd_00,rs_00);
    }
    else {
      generate_exception_end(ctx,0x14);
    }
    break;
  case 0x12:
  case 0x13:
    if (((uVar1 & 0x1f) == 0) && (uVar3 == 1)) {
      check_mips_64(ctx);
      gen_cl(ctx,opc,rd_00,rs_00);
    }
    else {
      generate_exception_end(ctx,0x14);
    }
    break;
  case 0x15:
    check_mips_64(ctx);
    uVar4 = extract32(ctx->opcode,6,2);
    gen_lsa(ctx,opc,rd_00,rs_00,rt_00,uVar4);
    break;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    uVar3 = ctx->opcode & 0xfc0007ff;
    if ((uVar3 - 0x98 < 4) || (uVar3 - 0xd8 < 4)) {
      gen_r6_muldiv(ctx,uVar3,rd_00,rs_00,rt_00);
    }
    else {
      generate_exception_end(ctx,0x14);
    }
    break;
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    uVar3 = ctx->opcode & 0xfc0007ff;
    if ((uVar3 - 0x9c < 4) || (uVar3 - 0xdc < 4)) {
      check_mips_64(ctx);
      gen_r6_muldiv(ctx,uVar3,rd_00,rs_00,rt_00);
    }
    else {
      generate_exception_end(ctx,0x14);
    }
    break;
  case 0x35:
  case 0x37:
    gen_cond_move(ctx,opc,rd_00,rs_00,rt_00);
  }
  return;
}

Assistant:

static void decode_opc_special_r6(CPUMIPSState *env, DisasContext *ctx)
{
    int rs, rt, rd, sa;
    uint32_t op1, op2;

    rs = (ctx->opcode >> 21) & 0x1f;
    rt = (ctx->opcode >> 16) & 0x1f;
    rd = (ctx->opcode >> 11) & 0x1f;
    sa = (ctx->opcode >> 6) & 0x1f;

    op1 = MASK_SPECIAL(ctx->opcode);
    switch (op1) {
    case OPC_LSA:
        gen_lsa(ctx, op1, rd, rs, rt, extract32(ctx->opcode, 6, 2));
        break;
    case OPC_MULT:
    case OPC_MULTU:
    case OPC_DIV:
    case OPC_DIVU:
        op2 = MASK_R6_MULDIV(ctx->opcode);
        switch (op2) {
        case R6_OPC_MUL:
        case R6_OPC_MUH:
        case R6_OPC_MULU:
        case R6_OPC_MUHU:
        case R6_OPC_DIV:
        case R6_OPC_MOD:
        case R6_OPC_DIVU:
        case R6_OPC_MODU:
            gen_r6_muldiv(ctx, op2, rd, rs, rt);
            break;
        default:
            MIPS_INVAL("special_r6 muldiv");
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case OPC_SELEQZ:
    case OPC_SELNEZ:
        gen_cond_move(ctx, op1, rd, rs, rt);
        break;
    case R6_OPC_CLO:
    case R6_OPC_CLZ:
        if (rt == 0 && sa == 1) {
            /*
             * Major opcode and function field is shared with preR6 MFHI/MTHI.
             * We need additionally to check other fields.
             */
            gen_cl(ctx, op1, rd, rs);
        } else {
            generate_exception_end(ctx, EXCP_RI);
        }
        break;
    case R6_OPC_SDBBP:
        if (is_uhi(extract32(ctx->opcode, 6, 20))) {
            // gen_helper_do_semihosting(tcg_ctx, tcg_ctx->cpu_env);
        } else {
            if (ctx->hflags & MIPS_HFLAG_SBRI) {
                generate_exception_end(ctx, EXCP_RI);
            } else {
                generate_exception_end(ctx, EXCP_DBp);
            }
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DLSA:
        check_mips_64(ctx);
        gen_lsa(ctx, op1, rd, rs, rt, extract32(ctx->opcode, 6, 2));
        break;
    case R6_OPC_DCLO:
    case R6_OPC_DCLZ:
        if (rt == 0 && sa == 1) {
            /*
             * Major opcode and function field is shared with preR6 MFHI/MTHI.
             * We need additionally to check other fields.
             */
            check_mips_64(ctx);
            gen_cl(ctx, op1, rd, rs);
        } else {
            generate_exception_end(ctx, EXCP_RI);
        }
        break;
    case OPC_DMULT:
    case OPC_DMULTU:
    case OPC_DDIV:
    case OPC_DDIVU:

        op2 = MASK_R6_MULDIV(ctx->opcode);
        switch (op2) {
        case R6_OPC_DMUL:
        case R6_OPC_DMUH:
        case R6_OPC_DMULU:
        case R6_OPC_DMUHU:
        case R6_OPC_DDIV:
        case R6_OPC_DMOD:
        case R6_OPC_DDIVU:
        case R6_OPC_DMODU:
            check_mips_64(ctx);
            gen_r6_muldiv(ctx, op2, rd, rs, rt);
            break;
        default:
            MIPS_INVAL("special_r6 muldiv");
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
#endif
    default:            /* Invalid */
        MIPS_INVAL("special_r6");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}